

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_inspect(REF_LIST ref_list)

{
  uint local_1c;
  REF_INT i;
  REF_LIST ref_list_local;
  
  if (ref_list == (REF_LIST)0x0) {
    ref_list_local._4_4_ = 2;
  }
  else {
    printf("list has %d items\n",(ulong)(uint)ref_list->n);
    for (local_1c = 0; (int)local_1c < ref_list->n; local_1c = local_1c + 1) {
      printf("value[%d] = %d\n",(ulong)local_1c,(ulong)(uint)ref_list->value[(int)local_1c]);
    }
    ref_list_local._4_4_ = 0;
  }
  return ref_list_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_list_inspect(REF_LIST ref_list) {
  REF_INT i;

  if (NULL == (void *)ref_list) return REF_NULL;

  printf("list has %d items\n", ref_list_n(ref_list));
  for (i = 0; i < ref_list_n(ref_list); i++)
    printf("value[%d] = %d\n", i, ref_list->value[i]);

  return REF_SUCCESS;
}